

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

double mathiu::impl::log(double __x)

{
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  Log *in_RDI;
  double extraout_XMM0_Qa;
  array<std::shared_ptr<const_mathiu::impl::Expr>,_2UL> aStack_38;
  
  std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2> *)&aStack_38,in_RSI
            );
  std::__shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&aStack_38._M_elems[1].
              super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>,in_RDX);
  std::make_shared<mathiu::impl::Expr_const,mathiu::impl::Log>(in_RDI);
  std::array<std::shared_ptr<const_mathiu::impl::Expr>,_2UL>::~array(&aStack_38);
  return extraout_XMM0_Qa;
}

Assistant:

inline ExprPtr log(ExprPtr const &lhs, ExprPtr const &rhs)
        {
            return makeSharedExprPtr(Log{{lhs, rhs}});
        }